

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O0

int __thiscall
VVCStreamReader::getTSDescriptor
          (VVCStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  bool bVar1;
  uint width;
  uint height;
  VideoAspectRatio ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar2;
  double fps;
  int descSize;
  uint8_t *descEnd;
  iterator iStack_100;
  uint i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint32_t *bufPos;
  uint8_t *descLength;
  uint8_t *descStart;
  undefined1 local_c8 [5];
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  uint8_t video_format;
  CheckStreamRez rez;
  bool hdmvDescriptors_local;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  VVCStreamReader *this_local;
  
  rez._158_1_ = hdmvDescriptors;
  rez._159_1_ = blurayMode;
  if ((this->m_firstFrame & 1U) != 0) {
    checkStream((CheckStreamRez *)local_c8,this,
                (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
                (int)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                (int)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer);
    CheckStreamRez::~CheckStreamRez((CheckStreamRez *)local_c8);
  }
  if ((rez._158_1_ & 1) == 0) {
    *dstBuff = '9';
    dstBuff[2] = (this->m_sps->super_VvcUnitWithProfile).profile_idc << 1 |
                 (this->m_sps->super_VvcUnitWithProfile).tier_flag;
    dstBuff[3] = (this->m_sps->super_VvcUnitWithProfile).ptl_num_sub_profiles;
    this_00 = &(this->m_sps->super_VvcUnitWithProfile).general_sub_profile_idc;
    __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    iStack_100 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    __range1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(dstBuff + 4);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff00);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
      *(uint *)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = *puVar2;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end1);
      __range1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 4);
    }
    *(byte *)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start =
         this->m_sps->progressive_source_flag << 7 | (this->m_sps->interlaced_source_flag & 1U) << 6
         | (this->m_sps->non_packed_constraint_flag & 1U) << 5 |
         ((this->m_sps->super_VvcUnitWithProfile).ptl_frame_only_constraint_flag & 1U) << 4;
    *(uint8_t *)
     ((long)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start + 1) =
         (this->m_sps->super_VvcUnitWithProfile).level_idc;
    *(undefined1 *)
     ((long)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start + 2) = 0;
    *(undefined1 *)
     ((long)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start + 3) = 0xc0;
    this_local._4_4_ = ((int)__range1 + 4) - (int)dstBuff;
    dstBuff[1] = (char)this_local._4_4_ + 0xfe;
  }
  else {
    *dstBuff = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    dstBuff[7] = '3';
    fps = MPEGStreamReader::getFPS(&this->super_MPEGStreamReader);
    bVar1 = getInterlaced(this);
    width = getStreamWidth(this);
    height = getStreamHeight(this);
    ar = MPEGStreamReader::getStreamAR(&this->super_MPEGStreamReader);
    M2TSStreamInfo::blurayStreamParams
              (fps,bVar1,width,height,ar,(uint8_t *)((long)&descStart + 7),
               (uint8_t *)((long)&descStart + 6),(uint8_t *)((long)&descStart + 5));
    dstBuff[8] = descStart._7_1_ << 4 | descStart._6_1_;
    dstBuff[9] = descStart._5_1_ << 4 | 0xf;
    this_local._4_4_ = 10;
  }
  return this_local._4_4_;
}

Assistant:

int VVCStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    if (m_firstFrame)
        CheckStreamRez rez = checkStream(m_buffer, static_cast<int>(m_bufEnd - m_buffer));

    if (hdmvDescriptors)
    {
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::HDMV);  // descriptor tag
        *dstBuff++ = 8;                                            // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;

        *dstBuff++ = static_cast<int>(StreamType::VIDEO_H266);  // stream_coding_type
        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);

        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);
        *dstBuff = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);

        return 10;  // total descriptor length
    }

    const uint8_t* descStart = dstBuff;

    // ITU-T Rec.H.222 Table 2-133 - VVC video descriptor
    *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::VVC);
    uint8_t* descLength = dstBuff++;  // descriptor length, filled at the end
    *dstBuff++ = static_cast<uint8_t>(m_sps->profile_idc << 1 | m_sps->tier_flag);
    *dstBuff++ = m_sps->ptl_num_sub_profiles;
    auto bufPos = reinterpret_cast<uint32_t*>(dstBuff);
    for (const auto i : m_sps->general_sub_profile_idc) *bufPos++ = i;
    dstBuff = reinterpret_cast<uint8_t*>(bufPos);
    *dstBuff++ =
        static_cast<uint8_t>(m_sps->progressive_source_flag << 7 | m_sps->interlaced_source_flag << 6 |
                             m_sps->non_packed_constraint_flag << 5 | m_sps->ptl_frame_only_constraint_flag << 4);
    *dstBuff++ = m_sps->level_idc;
    *dstBuff++ = 0;
    *dstBuff++ = 0xc0;

    const uint8_t* descEnd = dstBuff;
    const auto descSize = static_cast<int>(descEnd - descStart);
    *descLength = static_cast<uint8_t>(descSize - 2);  // fill descriptor length

    return descSize;
}